

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Detonation_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::LE_Detonation_PDU::SetMunitionEntityIDFlag(LE_Detonation_PDU *this,KBOOL F)

{
  if ((((this->m_DetonationFlag1Union).m_ui8Flag & 4) == 0) == F) {
    (this->m_DetonationFlag1Union).m_ui8Flag =
         (this->m_DetonationFlag1Union).m_ui8Flag & 0xfb | F * '\x04';
    (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength =
         ((ushort)F * 4 + (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength) - 2;
  }
  return;
}

Assistant:

void LE_Detonation_PDU::SetMunitionEntityIDFlag( KBOOL F )
{
    if( ( KUINT8 )F == m_DetonationFlag1Union.m_ui8MunitionId )return;

    m_DetonationFlag1Union.m_ui8MunitionId = F;

    if( F )
    {
        m_ui16PDULength += 2; // 2 = This flag only indicates the entity id field is included.
    }
    else
    {
        m_ui16PDULength -= 2;
    }
}